

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

uint8_t * __thiscall LayoutFile::loadTypes(LayoutFile *this,uint8_t *buf,uint count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  SceneW *this_00;
  Panel *this_01;
  ListPanelItem *this_02;
  undefined4 extraout_var;
  int local_64;
  int local_60;
  int i_1;
  int rootWidget;
  undefined1 local_50 [8];
  LayoutType layoutType;
  int i;
  uint count_local;
  uint8_t *buf_local;
  LayoutFile *this_local;
  
  if (buf == (uint8_t *)0x0) {
    this_local = (LayoutFile *)0x0;
  }
  else {
    layoutType._36_4_ = count;
    _i = buf;
    for (layoutType._32_4_ = 0; (uint)layoutType._32_4_ < (uint)layoutType._36_4_;
        layoutType._32_4_ = layoutType._32_4_ + 1) {
      LayoutType::LayoutType((LayoutType *)local_50);
      iVar2 = Util::readInt32(_i,(int *)local_50);
      iVar3 = Util::readString(_i + iVar2,(string *)&layoutType);
      _i = _i + iVar2 + iVar3;
      std::vector<LayoutType,_std::allocator<LayoutType>_>::push_back
                (&this->types,(value_type *)local_50);
      LayoutType::~LayoutType((LayoutType *)local_50);
    }
    iVar2 = Util::readInt32(_i,&local_60);
    this_local = (LayoutFile *)(_i + iVar2);
    pvVar4 = std::vector<LayoutType,_std::allocator<LayoutType>_>::operator[]
                       (&this->types,(long)local_60);
    bVar1 = std::operator==(&pvVar4->name,"Scene");
    if (bVar1) {
      this_00 = (SceneW *)operator_new(200);
      memset(this_00,0,200);
      SceneW::SceneW(this_00);
      this->root = (Widget *)this_00;
    }
    else {
      pvVar4 = std::vector<LayoutType,_std::allocator<LayoutType>_>::operator[]
                         (&this->types,(long)local_60);
      bVar1 = std::operator==(&pvVar4->name,"Panel");
      if (bVar1) {
        this_01 = (Panel *)operator_new(0xb8);
        memset(this_01,0,0xb8);
        Panel::Panel(this_01);
        this->root = (Widget *)this_01;
      }
      else {
        pvVar4 = std::vector<LayoutType,_std::allocator<LayoutType>_>::operator[]
                           (&this->types,(long)local_60);
        bVar1 = std::operator==(&pvVar4->name,"ListPanelItem");
        if (bVar1) {
          this_02 = (ListPanelItem *)operator_new(0xb8);
          memset(this_02,0,0xb8);
          ListPanelItem::ListPanelItem(this_02);
          this->root = (Widget *)this_02;
        }
      }
    }
    if (this->root == (Widget *)0x0) {
      printf("Unsupported root widget\r\n");
    }
    else {
      iVar2 = (*this->root->_vptr_Widget[1])(this->root,this_local);
      this_local = (LayoutFile *)CONCAT44(extraout_var,iVar2);
      for (local_64 = 0; local_64 < this->root->numChildren; local_64 = local_64 + 1) {
        processWidget(this,(uint8_t *)this_local,this->root);
      }
    }
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t *LayoutFile::loadTypes(uint8_t* buf, unsigned int count)
{
	if (buf == nullptr)
		return buf;

	for (int i = 0; i < count; i++)
	{
		LayoutType layoutType;

		buf += Util::readInt32(buf, layoutType.widgetIndex);
		buf += Util::readString(buf, layoutType.name);

		types.push_back(layoutType);
	}

	int rootWidget;
	buf += Util::readInt32(buf, rootWidget);

	if (types[rootWidget].name == "Scene")
	{
		root = new SceneW();
	}
	else if (types[rootWidget].name == "Panel")
	{
		root = new Panel();
	}
	else if (types[rootWidget].name == "ListPanelItem")
	{
		root = new ListPanelItem();
	}
	if (root == nullptr)
	{
		printf("Unsupported root widget\r\n");
		return buf;
	}

	buf = root->read(buf);

	for (int i = 0; i < root->numChildren; i++)
	{
		processWidget(buf, root);
	}

	return buf;
}